

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharCharacterIterator::move32(UCharCharacterIterator *this,int32_t delta,EOrigin origin)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  int32_t iVar4;
  int iVar5;
  char16_t cVar6;
  
  if (origin == kStart) {
    iVar4 = (this->super_CharacterIterator).begin;
    (this->super_CharacterIterator).pos = iVar4;
    if (0 < delta) {
      iVar2 = (this->super_CharacterIterator).end;
      pcVar3 = this->text;
      for (; 0 < delta; delta = delta + -1) {
        if (iVar4 < iVar2) {
          cVar6 = pcVar3[iVar4];
        }
        else {
          if (-1 < iVar2) {
            return iVar4;
          }
          cVar6 = pcVar3[iVar4];
          if (cVar6 == L'\0') {
            return iVar4;
          }
        }
        iVar5 = iVar4 + 1;
        (this->super_CharacterIterator).pos = iVar5;
        if ((((cVar6 & 0xfc00U) == 0xd800) && (iVar5 != iVar2)) &&
           ((pcVar3[iVar5] & 0xfc00U) == 0xdc00)) {
          (this->super_CharacterIterator).pos = iVar4 + 2;
          iVar5 = iVar4 + 2;
        }
        iVar4 = iVar5;
      }
    }
  }
  else if (origin == kCurrent) {
    if (delta < 1) {
      iVar5 = -delta;
      iVar4 = (this->super_CharacterIterator).pos;
      iVar2 = (this->super_CharacterIterator).begin;
      pcVar3 = this->text;
      while ((0 < iVar5 && (iVar2 < iVar4))) {
        iVar1 = iVar4 + -1;
        (this->super_CharacterIterator).pos = iVar1;
        if ((iVar2 < iVar1) &&
           (((pcVar3[(long)iVar4 + -1] & 0xfc00U) == 0xdc00 &&
            ((pcVar3[(long)iVar4 + -2] & 0xfc00U) == 0xd800)))) {
          (this->super_CharacterIterator).pos = iVar4 + -2;
          iVar1 = iVar4 + -2;
        }
        iVar4 = iVar1;
        iVar5 = iVar5 + -1;
      }
    }
    else {
      iVar4 = (this->super_CharacterIterator).pos;
      iVar2 = (this->super_CharacterIterator).end;
      pcVar3 = this->text;
      for (; 0 < delta; delta = delta + -1) {
        if (iVar4 < iVar2) {
          cVar6 = pcVar3[iVar4];
        }
        else {
          if (-1 < iVar2) {
            return iVar4;
          }
          cVar6 = pcVar3[iVar4];
          if (cVar6 == L'\0') {
            return iVar4;
          }
        }
        iVar5 = iVar4 + 1;
        (this->super_CharacterIterator).pos = iVar5;
        if ((((cVar6 & 0xfc00U) == 0xd800) && (iVar5 != iVar2)) &&
           ((pcVar3[iVar5] & 0xfc00U) == 0xdc00)) {
          (this->super_CharacterIterator).pos = iVar4 + 2;
          iVar5 = iVar4 + 2;
        }
        iVar4 = iVar5;
      }
    }
  }
  else {
    if (origin != kEnd) {
      return (this->super_CharacterIterator).pos;
    }
    iVar4 = (this->super_CharacterIterator).end;
    (this->super_CharacterIterator).pos = iVar4;
    if (delta < 0) {
      iVar5 = -delta;
      iVar2 = (this->super_CharacterIterator).begin;
      pcVar3 = this->text;
      while ((0 < iVar5 && (iVar2 < iVar4))) {
        iVar1 = iVar4 + -1;
        (this->super_CharacterIterator).pos = iVar1;
        if ((iVar2 < iVar1) &&
           (((pcVar3[(long)iVar4 + -1] & 0xfc00U) == 0xdc00 &&
            ((pcVar3[(long)iVar4 + -2] & 0xfc00U) == 0xd800)))) {
          (this->super_CharacterIterator).pos = iVar4 + -2;
          iVar1 = iVar4 + -2;
        }
        iVar4 = iVar1;
        iVar5 = iVar5 + -1;
      }
    }
  }
  return iVar4;
}

Assistant:

int32_t
UCharCharacterIterator::move32(int32_t delta, CharacterIterator::EOrigin origin) {
    // this implementation relies on the "safe" version of the UTF macros
    // (or the trustworthiness of the caller)
    switch(origin) {
    case kStart:
        pos = begin;
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        }
        break;
    case kCurrent:
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        } else {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    case kEnd:
        pos = end;
        if(delta < 0) {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    default:
        break;
    }

    return pos;
}